

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_parentheses_expression(gravity_parser_t *parser)

{
  gnode_t *expr;
  gravity_parser_t *parser_local;
  
  parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
  parser_local = (gravity_parser_t *)parse_expression(parser);
  if (parser_local == (gravity_parser_t *)0x0) {
    parser_local = (gravity_parser_t *)0x0;
  }
  else {
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_parentheses_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_parentheses_expression");

    // check and consume TOK_OP_OPEN_PARENTHESIS
    parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse expression
    gnode_t *expr = parse_expression(parser);
    CHECK_NODE(expr);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    return expr;
}